

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_num2str(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  operand local_e4;
  operand local_e0 [2];
  string local_d8;
  string error;
  string cont;
  string hex;
  string oct;
  string flonum;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  label_to_string_abi_cxx11_(&flonum,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&cont,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&oct,psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&hex,psVar1,lab_01);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_d8,psVar1,lab_02);
    std::__cxx11::string::operator=((string *)&error,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    local_d8._M_dataplus._M_p._0_4_ = 5;
    local_e4 = R11;
    local_e0[0] = NUMBER;
    local_e0[1] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
    local_d8._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_d8,&error);
    local_d8._M_dataplus._M_p._0_4_ = 0x5a;
    local_e4 = RDX;
    local_e0[0] = NUMBER;
    local_e0[1] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
    local_d8._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_d8,&error);
  }
  local_d8._M_dataplus._M_p._0_4_ = 0x5a;
  local_e4 = RCX;
  local_e0[0] = NUMBER;
  local_e0[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 0x34;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&flonum);
  local_d8._M_dataplus._M_p._0_4_ = 0x4e;
  local_e4 = RCX;
  local_e0[0] = NUMBER;
  local_e0[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 5;
  local_e4 = RDX;
  local_e0[0] = NUMBER;
  local_e0[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&oct);
  local_d8._M_dataplus._M_p._0_4_ = 5;
  local_e4 = RDX;
  local_e0[0] = NUMBER;
  local_e0[1] = 0x20;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&hex);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = R15;
  local_e0[0] = MEM_R10;
  local_e0[1] = 200;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&cont);
  local_d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&oct);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = R15;
  local_e0[0] = MEM_R10;
  local_e0[1] = 0xd0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&cont);
  local_d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&hex);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = R15;
  local_e0[0] = MEM_R10;
  local_e0[1] = 0xd8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&cont);
  local_d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&flonum);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,RCX,R11,&error);
  }
  local_e4 = AH;
  local_e0[0] = RCX;
  local_e0[1] = 0x39;
  local_d8._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_e4,local_e0,local_e0 + 1,(unsigned_long *)&local_d8);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RCX,R11,&error);
  }
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = RCX;
  local_e0[0] = MEM_RCX;
  local_e0[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = R15;
  local_e0[0] = MEM_R10;
  local_e0[1] = 0xe0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_d8._M_dataplus._M_p._0_4_ = 0x4b;
  local_e4 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x4b;
  local_e4 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x41;
  local_e4 = XMM0;
  local_e0[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = RSI;
  local_e0[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = RDI;
  local_e0[0] = MEM_R10;
  local_e0[1] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  save_before_foreign_call(code);
  align_stack(code);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = R15;
  local_e0[0] = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = RAX;
  local_e0[0] = NUMBER;
  local_e0[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  local_e4 = ST6;
  local_e0[0] = R11;
  local_e0[1] = 0x39;
  local_d8._M_dataplus._M_p = (pointer)_skiwi_sprintf_floating;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_e4,local_e0,local_e0 + 1,(unsigned_long *)&local_d8);
  local_d8._M_dataplus._M_p._0_4_ = 4;
  local_e4 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = R10;
  local_e0[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_d8._M_dataplus._M_p._0_4_ = 0x4a;
  local_e4 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x4a;
  local_e4 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  allocate_buffer_as_string(code);
  local_d8._M_dataplus._M_p._0_4_ = 0x2c;
  local_e4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d8,&cont);
  local_d8._M_dataplus._M_p._0_4_ = 0x4b;
  local_e4 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x4b;
  local_e4 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = RDX;
  local_e0[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = RSI;
  local_e0[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = RDI;
  local_e0[0] = MEM_R10;
  local_e0[1] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d8,&local_e4,local_e0,(int *)(local_e0 + 1));
  save_before_foreign_call(code);
  align_stack(code);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = R15;
  local_e0[0] = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  local_d8._M_dataplus._M_p._0_4_ = 0x5c;
  local_e4 = RAX;
  local_e0[0] = local_e4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  local_e4 = ST6;
  local_e0[0] = R11;
  local_e0[1] = 0x39;
  local_d8._M_dataplus._M_p = (pointer)_skiwi_sprintf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_e4,local_e0,local_e0 + 1,(unsigned_long *)&local_d8);
  local_d8._M_dataplus._M_p._0_4_ = 4;
  local_e4 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x40;
  local_e4 = R10;
  local_e0[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4,local_e0);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_d8._M_dataplus._M_p._0_4_ = 0x4a;
  local_e4 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  local_d8._M_dataplus._M_p._0_4_ = 0x4a;
  local_e4 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  allocate_buffer_as_string(code);
  local_d8._M_dataplus._M_p._0_4_ = 0x2c;
  local_e4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d8,&local_e4);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_num2str_contract_violation);
  }
  std::__cxx11::string::~string((string *)&hex);
  std::__cxx11::string::~string((string *)&oct);
  std::__cxx11::string::~string((string *)&cont);
  std::__cxx11::string::~string((string *)&flonum);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_num2str(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string flonum = label_to_string(label++);
  std::string cont = label_to_string(label++);
  std::string oct = label_to_string(label++);
  std::string hex = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    }
  code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::JNE, flonum);
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 16);
  code.add(asmcode::JES, oct);
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 32);
  code.add(asmcode::JES, hex);
  code.add(asmcode::MOV, asmcode::R15, DCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, oct);
  code.add(asmcode::MOV, asmcode::R15, OCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, hex);
  code.add(asmcode::MOV, asmcode::R15, XCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, flonum);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::MOV, asmcode::R15, GCVT);

  /*
  Windows:
  rcx
  rdx
  r8

  Linux:
  rdi
  rsi
  rdx
  */
#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::RCX);
  code.add(asmcode::MOVQ, asmcode::XMM2, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RCX, BUFFER);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);

  code.add(asmcode::MOVQ, asmcode::XMM0, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RDI, BUFFER);
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf_floating);
#else
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf_floating);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
#else
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif

  allocate_buffer_as_string(code);

  code.add(asmcode::JMP, CONTINUE);


  code.add(asmcode::LABEL, cont); // rcx contains number, r15 contains format

  /*
  Windows:
  rcx
  rdx
  r8

  Linux:
  rdi
  rsi
  rdx
  */
#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RCX, BUFFER);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);

  code.add(asmcode::MOV, asmcode::RDX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RDI, BUFFER);
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf);
#else
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
#else
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif

  allocate_buffer_as_string(code);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_num2str_contract_violation);
    }
  }